

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O1

bool __thiscall osc::ReceivedMessageArgument::AsBool(ReceivedMessageArgument *this)

{
  char cVar1;
  undefined8 *puVar2;
  pointer_____offset_0x10___ *ppuVar3;
  
  if (this->typeTagPtr_ == (char *)0x0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    puVar2[1] = "missing argument";
    *puVar2 = &PTR__exception_00179c90;
    ppuVar3 = &MissingArgumentException::typeinfo;
  }
  else {
    cVar1 = *this->typeTagPtr_;
    if ((cVar1 == 'F') || (cVar1 == 'T')) {
      return cVar1 == 'T';
    }
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    puVar2[1] = "wrong argument type";
    *puVar2 = &PTR__exception_00179cb8;
    ppuVar3 = &WrongArgumentTypeException::typeinfo;
  }
  __cxa_throw(puVar2,ppuVar3,std::exception::~exception);
}

Assistant:

bool ReceivedMessageArgument::AsBool() const
{
    if( !typeTagPtr_ )
        throw MissingArgumentException();
	else if( *typeTagPtr_ == TRUE_TYPE_TAG )
		return true;
	else if( *typeTagPtr_ == FALSE_TYPE_TAG )
		return false;
	else
		throw WrongArgumentTypeException();
}